

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_sprite.cpp
# Opt level: O1

void __thiscall GLSprite::Draw(GLSprite *this,int pass)

{
  FColormap *cmap;
  float fVar1;
  double dVar2;
  FRenderStyle style;
  TArray<lightlist_t,_lightlist_t> *pTVar3;
  lightlist_t *plVar4;
  long lVar5;
  long lVar6;
  FFlatVertexBuffer *pFVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [8];
  bool bVar11;
  BYTE BVar12;
  bool bVar13;
  uint uVar14;
  int iVar15;
  int rellight;
  long lVar16;
  uint uVar17;
  particle_t *particle;
  AActor *pAVar18;
  secplane_t *top;
  secplane_t *bottom;
  ulong uVar19;
  bool isadditive;
  float fVar20;
  float fVar21;
  FColormap thiscm;
  FQuadDrawer qd;
  secplane_t topp;
  secplane_t bottomp;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  float local_c8;
  undefined8 local_c4;
  float local_bc;
  int local_ac;
  FQuadDrawer local_a8;
  FColormap *local_98;
  ulong local_90;
  secplane_t local_88;
  secplane_t local_58;
  
  if ((pass & 0xfffffffdU) == 1) {
    return;
  }
  rellight = gl_weaponlight.Value * extralight;
  isadditive = false;
  if (this->fullbright != false) {
    rellight = 0;
  }
  local_ac = pass;
  if (pass == 4) {
    if ((this->RenderStyle).field_0.BlendOp != '\x01') {
      gl_RenderState.mBrightmapEnabled = false;
    }
    style = this->RenderStyle;
    if (((this->trans <= 0.9999999) ||
        ((this->actor != (AActor *)0x0 & this->fullbright &
         (gl_fixedcolormap == 0 && gl_usecolorblending.Value)) != 1)) ||
       (this->gltexture == (FMaterial *)0x0)) {
      bVar11 = false;
    }
    else {
      bVar11 = FMaterial::GetTransparent(this->gltexture);
      bVar11 = !bVar11;
    }
    isadditive = false;
    gl_SetRenderStyle(style,false,bVar11);
    gl_RenderState.mAlphaThreshold = -0.001;
    if (this->hw_styleflags != '\x02') {
      gl_RenderState.mAlphaThreshold = gl_mask_sprite_threshold.Value + -0.001;
    }
    BVar12 = (this->RenderStyle).field_0.BlendOp;
    if (BVar12 == '\x01') {
      isadditive = (this->RenderStyle).field_0.DestAlpha == '\x01';
    }
    else if (BVar12 == '\b') {
      uVar17 = (this->Colormap).FadeColor.field_0.d;
      if ((uVar17 & 0xff) == 0 && (uVar17 >> 8 & 0xff) + (uVar17 >> 0x10 & 0xff) == 0) {
        gl_RenderState.mColor.vec[3] = 0.44;
      }
      else {
        fVar20 = (float)ViewPos.X - this->x;
        fVar21 = (float)ViewPos.Y - this->y;
        if ((this->Colormap).FadeColor.field_0.field_0.a == '\0') {
          iVar15 = 0xff - this->lightlevel;
          if (0xfe < iVar15) {
            iVar15 = 0xff;
          }
          BVar12 = '<';
          if (0x3c < iVar15) {
            BVar12 = (BYTE)iVar15;
          }
          (this->Colormap).FadeColor.field_0.field_0.a = BVar12;
        }
        fVar20 = expf(SQRT(fVar21 * fVar21 + fVar20 * fVar20) * 1.6e-05 *
                      (float)(int)-(uint)(this->Colormap).FadeColor.field_0.field_0.a);
        gl_RenderState.mColor.vec[3] = fVar20 * 0.44 + 0.022;
      }
      gl_RenderState.mAlphaThreshold = gl_mask_sprite_threshold.Value + -0.001;
      gl_RenderState.mDesaturation = (this->Colormap).desaturation;
      gl_RenderState.mColor.vec[0] = 0.2;
      gl_RenderState.mColor.vec[1] = 0.2;
      gl_RenderState.mColor.vec[2] = 0.2;
      isadditive = true;
    }
  }
  if ((this->RenderStyle).field_0.BlendOp != '\b') {
    if (((gl_lights.Value == true) && (GLRenderer->mLightCount != 0)) &&
       ((gl_fixedcolormap == 0 && (this->fullbright == false)))) {
      particle = (particle_t *)0x0;
      pAVar18 = (AActor *)0x0;
      if (gl_light_sprites.Value != false) {
        pAVar18 = this->actor;
      }
      if (gl_light_particles.Value != false) {
        particle = this->particle;
      }
      gl_SetDynSpriteLight(pAVar18,particle);
    }
    gl_SetColor(this->lightlevel,rellight,&this->Colormap,this->trans,false);
  }
  gl_RenderState.mObjectColor.field_0 =
       (anon_union_4_2_12391d7c_for_PalEntry_0)
       *(anon_union_4_2_12391d7c_for_PalEntry_0 *)&(this->ThingColor).field_0.field_0;
  uVar17 = (this->Colormap).FadeColor.field_0.d;
  if ((uVar17 & 0xff) == 0 && (uVar17 >> 8 & 0xff) + (uVar17 >> 0x10 & 0xff) == 0) {
    this->foglevel = (BYTE)this->lightlevel;
  }
  if (((this->RenderStyle).field_0.Flags & 0x40) != 0) {
    (this->Colormap).FadeColor.field_0.d = 0;
    isadditive = true;
  }
  if (((this->RenderStyle).field_0.BlendOp & 0xfe) == 2) {
    if (this->modelframe == (FSpriteModelFrame *)0x0) {
      uVar17 = (this->Colormap).FadeColor.field_0.d;
      if ((uVar17 & 0xff) != 0 || (uVar17 >> 8 & 0xff) + (uVar17 >> 0x10 & 0xff) != 0) {
        gl_RenderState.mAlphaThreshold = 0.0;
        bVar11 = true;
        goto LAB_0044353f;
      }
    }
    else {
      (this->RenderStyle).field_0.BlendOp = '\x04';
    }
  }
  bVar11 = false;
LAB_0044353f:
  cmap = &this->Colormap;
  if (bVar11) {
    gl_RenderState.mFogEnabled = false;
    gl_RenderState.mFogColor.field_0 =
         (anon_union_4_2_12391d7c_for_PalEntry_0)
         (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)0x0;
    gl_RenderState.mLightParms[2] = -0.0;
  }
  else {
    gl_SetFog((uint)this->foglevel,rellight,cmap,isadditive);
  }
  if (this->gltexture == (FMaterial *)0x0) {
    if (this->modelframe == (FSpriteModelFrame *)0x0) {
      gl_RenderState.mTextureEnabled = false;
    }
  }
  else {
    FRenderState::SetMaterial
              (&gl_RenderState,this->gltexture,3,this->translation,this->OverrideShader,
               (bool)(((this->RenderStyle).field_0.Flags & 4) >> 2));
  }
  pTVar3 = this->lightlist;
  if (pTVar3 == (TArray<lightlist_t,_lightlist_t> *)0x0) {
    uVar17 = 1;
  }
  else {
    uVar17 = pTVar3->Count;
  }
  bVar8 = this->topclip != 1e+19;
  bVar9 = this->bottomclip != -1e+19;
  bVar13 = bVar9 || (bVar8 || pTVar3 != (TArray<lightlist_t,_lightlist_t> *)0x0);
  local_98 = cmap;
  if ((bVar9 || (bVar8 || pTVar3 != (TArray<lightlist_t,_lightlist_t> *)0x0)) &&
     (((byte)gl.flags & 0x20) == 0)) {
    gl_RenderState.mSplitEnabled = true;
    (*_ptrc_glEnable)(0x3003);
    (*_ptrc_glEnable)(0x3004);
  }
  local_58.normal.X = 0.0;
  local_58.normal.Y = 0.0;
  local_58.normal.Z = -1.0;
  local_58.D = (double)this->bottomclip;
  local_58.negiC = 0.0;
  local_88.normal.X = 0.0;
  local_88.normal.Y = 0.0;
  local_88.normal.Z = -1.0;
  local_88.D = (double)this->topclip;
  local_88.negiC = 0.0;
  if (uVar17 != 0) {
    local_90 = (ulong)uVar17;
    lVar16 = 0x50;
    uVar19 = 0;
    do {
      pTVar3 = this->lightlist;
      if (pTVar3 == (TArray<lightlist_t,_lightlist_t> *)0x0) {
        if (bVar13) {
          gl_RenderState.mSplitTopPlane.vec[0] = (float)local_88.normal.X;
          gl_RenderState.mSplitTopPlane.vec[1] = (float)local_88.normal.Y;
          gl_RenderState.mSplitTopPlane.vec[3] = (float)local_88.D;
          gl_RenderState.mSplitTopPlane.vec[2] = (float)(1.0 / local_88.normal.Z);
          gl_RenderState.mSplitBottomPlane.vec[0] = (float)local_58.normal.X;
          gl_RenderState.mSplitBottomPlane.vec[1] = (float)local_58.normal.Y;
          gl_RenderState.mSplitBottomPlane.vec[2] = (float)(1.0 / local_58.normal.Z);
          gl_RenderState.mSplitBottomPlane.vec[3] = (float)local_58.D;
        }
      }
      else {
        top = &local_88;
        if (uVar19 != 0) {
          top = (secplane_t *)((long)&pTVar3->Array[-1].plane.normal.X + lVar16);
        }
        bottom = &local_58;
        if (uVar19 != pTVar3->Count - 1) {
          bottom = (secplane_t *)((long)&(pTVar3->Array->plane).normal.X + lVar16);
        }
        if (*(long *)((long)pTVar3->Array + lVar16 + -8) == 0) {
          uVar17 = this->lightlevel;
        }
        else {
          uVar17 = (uint)**(short **)((long)pTVar3->Array + lVar16 + -0x28);
          if (0xfe < (int)uVar17) {
            uVar17 = 0xff;
          }
          if ((short)uVar17 < 1) {
            uVar17 = 0;
          }
        }
        pAVar18 = this->actor;
        uVar14 = uVar17;
        if (pAVar18 != (AActor *)0x0) {
          dVar2 = (pAVar18->Prev).X;
          local_e0 = (pAVar18->Prev).Y;
          local_d8 = (pAVar18->Prev).Z;
          local_e8 = (undefined1  [8])(((pAVar18->__Pos).X - dVar2) * r_TicFracF + dVar2);
          local_e0 = ((pAVar18->__Pos).Y - local_e0) * r_TicFracF + local_e0;
          local_d8 = ((pAVar18->__Pos).Z - local_d8) * r_TicFracF + local_d8;
          uVar14 = gl_CheckSpriteGlow(pAVar18->Sector,uVar17,(DVector3 *)local_e8);
          uVar14 = uVar14 & 0xff;
        }
        plVar4 = this->lightlist->Array;
        local_e8._0_4_ = *(undefined4 *)(*(long *)((long)plVar4 + lVar16 + -0x20) + 8);
        local_e8._4_4_ = (this->Colormap).FadeColor.field_0.d;
        lVar5 = *(long *)((long)plVar4 + lVar16 + -0x20);
        local_e0._0_4_ = *(float *)(lVar5 + 0x10);
        local_e0._4_4_ = (uint)*(byte *)(lVar5 + 0xb);
        lVar6 = *(long *)((long)plVar4 + lVar16 + -8);
        if (((lVar6 != 0) && ((*(byte *)(lVar6 + 0x5b) & 8) != 0)) &&
           ((*(uint *)(lVar5 + 0xc) & 0xffffff) != 0)) {
          local_e8._4_4_ = *(uint *)(lVar5 + 0xc);
        }
        auVar10 = local_e8;
        if (glset.nocoloredspritelighting == true) {
          local_e8[1] = (undefined1)
                        (((((uint)(byte)local_e8[0] +
                           (uint)(byte)local_e8[1] + (uint)(byte)local_e8[2]) / 3) * 2 + 0xff) *
                         0x5556 >> 0x10);
          local_e8[0] = local_e8[1];
          local_e8._3_5_ = auVar10._3_5_;
          local_e8[2] = local_e8[1];
        }
        gl_SetColor(uVar14,rellight,(FColormap *)local_e8,this->trans,false);
        if (!bVar11) {
          gl_SetFog(uVar17,rellight,(FColormap *)local_e8,isadditive);
        }
        FRenderState::SetSplitPlanes(&gl_RenderState,top,bottom);
      }
      if (this->modelframe == (FSpriteModelFrame *)0x0) {
        FRenderState::Apply(&gl_RenderState);
        dVar2 = local_d8;
        if (((this->actor->renderflags).Value & 0x7000) != 0x2000) {
          CalculateVertices(this,(FVector3 *)local_e8);
          dVar2 = local_d8;
        }
        iVar15 = gl.buffermethod;
        local_d8._4_4_ = (float)((ulong)dVar2 >> 0x20);
        local_d8._0_4_ = SUB84(dVar2,0);
        local_a8.p = FQuadDrawer::buffer;
        if (gl.buffermethod != 1) {
          pFVar7 = GLRenderer->mVBO;
          local_a8.ndx = pFVar7->mCurIndex;
          pFVar7->mCurIndex = local_a8.ndx + 4U;
          if (0x1e828b < local_a8.ndx + 4U) {
            pFVar7->mCurIndex = pFVar7->mIndex;
          }
          local_a8.p = pFVar7->map + (uint)local_a8.ndx;
        }
        fVar20 = this->ul;
        fVar21 = this->vt;
        (local_a8.p)->x = (float)local_e8._0_4_;
        (local_a8.p)->z = (float)local_e8._4_4_;
        (local_a8.p)->y = (float)local_e0;
        (local_a8.p)->u = fVar20;
        (local_a8.p)->v = fVar21;
        fVar1 = this->ur;
        local_a8.p[1].x = (float)local_e0._4_4_;
        local_a8.p[1].z = (float)(undefined4)local_d8;
        local_a8.p[1].y = local_d8._4_4_;
        local_a8.p[1].u = fVar1;
        local_a8.p[1].v = fVar21;
        fVar21 = this->vb;
        local_a8.p[2].x = (float)(undefined4)local_d0;
        local_a8.p[2].z = (float)local_d0._4_4_;
        local_a8.p[2].y = local_c8;
        local_a8.p[2].u = fVar20;
        local_a8.p[2].v = fVar21;
        local_a8.p[3].x = (float)(undefined4)local_c4;
        local_a8.p[3].z = (float)local_c4._4_4_;
        local_a8.p[3].y = local_bc;
        local_a8.p[3].u = fVar1;
        local_a8.p[3].v = fVar21;
        local_d8 = dVar2;
        if (iVar15 == 1) {
          FQuadDrawer::DoRender(&local_a8,5);
        }
        else {
          (*_ptrc_glDrawArrays)(5,local_a8.ndx,4);
        }
        if (bVar11) {
          gl_SetFog((uint)this->foglevel,rellight,local_98,isadditive);
          gl_RenderState.mColormapState = 0x10000000;
          if (gl_direct_state_change.Value == false) {
            gl_RenderState.mBlendEquation = 0x8006;
          }
          else {
            (*_ptrc_glBlendEquation)(0x8006);
          }
          if (gl_direct_state_change.Value == false) {
            gl_RenderState.mSrcBlend = 0x302;
            gl_RenderState.mDstBlend = 0x303;
          }
          else {
            (*_ptrc_glBlendFunc)(0x302,0x303);
          }
          FRenderState::Apply(&gl_RenderState);
          if (gl.buffermethod == 1) {
            FQuadDrawer::DoRender(&local_a8,5);
          }
          else {
            (*_ptrc_glDrawArrays)(5,local_a8.ndx,4);
          }
          gl_RenderState.mColormapState = 0;
        }
      }
      else {
        gl_RenderModel(this);
      }
      uVar19 = uVar19 + 1;
      lVar16 = lVar16 + 0x50;
    } while (local_90 != uVar19);
  }
  if ((bVar13) && (((byte)gl.flags & 0x20) == 0)) {
    gl_RenderState.mSplitEnabled = false;
    (*_ptrc_glDisable)(0x3003);
    (*_ptrc_glDisable)(0x3004);
  }
  if (local_ac == 4) {
    gl_RenderState.mBrightmapEnabled = true;
    if (gl_direct_state_change.Value == false) {
      gl_RenderState.mSrcBlend = 0x302;
      gl_RenderState.mDstBlend = 0x303;
    }
    else {
      (*_ptrc_glBlendFunc)(0x302,0x303);
    }
    if (gl_direct_state_change.Value == false) {
      gl_RenderState.mBlendEquation = 0x8006;
    }
    else {
      (*_ptrc_glBlendEquation)(0x8006);
    }
    gl_RenderState.mTextureMode = 0;
  }
  gl_RenderState.mDynColor.vec[2] = 0.0;
  gl_RenderState.mDynColor.vec[3] = 0.0;
  gl_RenderState.mDynColor.vec[0] = 0.0;
  gl_RenderState.mDynColor.vec[1] = 0.0;
  gl_RenderState.mObjectColor.field_0 =
       (anon_union_4_2_12391d7c_for_PalEntry_0)
       (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)0xffffffff;
  gl_RenderState.mTextureEnabled = true;
  return;
}

Assistant:

void GLSprite::Draw(int pass)
{
	if (pass == GLPASS_DECALS || pass == GLPASS_LIGHTSONLY) return;

	bool additivefog = false;
	bool foglayer = false;
	int rel = fullbright? 0 : getExtraLight();

	if (pass==GLPASS_TRANSLUCENT)
	{
		// The translucent pass requires special setup for the various modes.

		// for special render styles brightmaps would not look good - especially for subtractive.
		if (RenderStyle.BlendOp != STYLEOP_Add)
		{
			gl_RenderState.EnableBrightmap(false);
		}

		gl_SetRenderStyle(RenderStyle, false, 
			// The rest of the needed checks are done inside gl_SetRenderStyle
			trans > 1.f - FLT_EPSILON && gl_usecolorblending && gl_fixedcolormap == CM_DEFAULT && actor && 
			fullbright && gltexture && !gltexture->GetTransparent());

		if (hw_styleflags == STYLEHW_NoAlphaTest)
		{
			gl_RenderState.AlphaFunc(GL_GEQUAL, 0.f);
		}
		else
		{
			gl_RenderState.AlphaFunc(GL_GEQUAL, gl_mask_sprite_threshold);
		}

		if (RenderStyle.BlendOp == STYLEOP_Shadow)
		{
			float fuzzalpha=0.44f;
			float minalpha=0.1f;

			// fog + fuzz don't work well without some fiddling with the alpha value!
			if (!gl_isBlack(Colormap.FadeColor))
			{
				float dist=Dist2(ViewPos.X, ViewPos.Y, x,y);

				if (!Colormap.FadeColor.a) Colormap.FadeColor.a=clamp<int>(255-lightlevel,60,255);

				// this value was determined by trial and error and is scale dependent!
				float factor=0.05f+exp(-Colormap.FadeColor.a*dist/62500.f);
				fuzzalpha*=factor;
				minalpha*=factor;
			}

			gl_RenderState.AlphaFunc(GL_GEQUAL, gl_mask_sprite_threshold);
			gl_RenderState.SetColor(0.2f,0.2f,0.2f,fuzzalpha, Colormap.desaturation);
			additivefog = true;
		}
		else if (RenderStyle.BlendOp == STYLEOP_Add && RenderStyle.DestAlpha == STYLEALPHA_One)
		{
			additivefog = true;
		}
	}
	if (RenderStyle.BlendOp!=STYLEOP_Shadow)
	{
		if (gl_lights && GLRenderer->mLightCount && !gl_fixedcolormap && !fullbright)
		{
			gl_SetDynSpriteLight(gl_light_sprites ? actor : NULL, gl_light_particles ? particle : NULL);
		}
		gl_SetColor(lightlevel, rel, Colormap, trans);
	}
	gl_RenderState.SetObjectColor(ThingColor);

	if (gl_isBlack(Colormap.FadeColor)) foglevel=lightlevel;

	if (RenderStyle.Flags & STYLEF_FadeToBlack) 
	{
		Colormap.FadeColor=0;
		additivefog = true;
	}

	if (RenderStyle.BlendOp == STYLEOP_RevSub || RenderStyle.BlendOp == STYLEOP_Sub)
	{
		if (!modelframe)
		{
			// non-black fog with subtractive style needs special treatment
			if (!gl_isBlack(Colormap.FadeColor))
			{
				foglayer = true;
				// Due to the two-layer approach we need to force an alpha test that lets everything pass
				gl_RenderState.AlphaFunc(GL_GREATER, 0);
			}
		}
		else RenderStyle.BlendOp = STYLEOP_Fuzz;	// subtractive with models is not going to work.
	}

	if (!foglayer) gl_SetFog(foglevel, rel, &Colormap, additivefog);
	else
	{
		gl_RenderState.EnableFog(false);
		gl_RenderState.SetFog(0, 0);
	}

	if (gltexture) gl_RenderState.SetMaterial(gltexture, CLAMP_XY, translation, OverrideShader, !!(RenderStyle.Flags & STYLEF_RedIsAlpha));
	else if (!modelframe) gl_RenderState.EnableTexture(false);

		//gl_SetColor(lightlevel, rel, Colormap, trans);

	unsigned int iter = lightlist? lightlist->Size() : 1;
	bool clipping = false;
	if (lightlist || topclip != LARGE_VALUE || bottomclip != -LARGE_VALUE)
	{
		clipping = true;
		gl_RenderState.EnableSplit(true);
	}

	secplane_t bottomp = { { 0, 0, -1. }, bottomclip };
	secplane_t topp = { { 0, 0, -1. }, topclip };
	for (unsigned i = 0; i < iter; i++)
	{
		if (lightlist)
		{
			// set up the light slice
			secplane_t *topplane = i == 0 ? &topp : &(*lightlist)[i].plane;
			secplane_t *lowplane = i == (*lightlist).Size() - 1 ? &bottomp : &(*lightlist)[i + 1].plane;

			int thislight = (*lightlist)[i].caster != NULL ? gl_ClampLight(*(*lightlist)[i].p_lightlevel) : lightlevel;
			int thisll = actor == nullptr? thislight : (uint8_t)gl_CheckSpriteGlow(actor->Sector, thislight, actor->InterpolatedPosition(r_TicFracF));

			FColormap thiscm;
			thiscm.FadeColor = Colormap.FadeColor;
			thiscm.CopyFrom3DLight(&(*lightlist)[i]);
			if (glset.nocoloredspritelighting)
			{
				thiscm.Decolorize();
			}

			gl_SetColor(thisll, rel, thiscm, trans);
			if (!foglayer)
			{
				gl_SetFog(thislight, rel, &thiscm, additivefog);
			}
			gl_RenderState.SetSplitPlanes(*topplane, *lowplane);
		}
		else if (clipping)
		{
			gl_RenderState.SetSplitPlanes(topp, bottomp);
		}

		if (!modelframe)
		{
			gl_RenderState.Apply();

			FVector3 v[4];
			if ((actor->renderflags & RF_SPRITETYPEMASK) == RF_FLATSPRITE)
			{
			}
			else
			{
				CalculateVertices(v);
			}


			FQuadDrawer qd;
			qd.Set(0, v[0][0], v[0][1], v[0][2], ul, vt);
			qd.Set(1, v[1][0], v[1][1], v[1][2], ur, vt);
			qd.Set(2, v[2][0], v[2][1], v[2][2], ul, vb);
			qd.Set(3, v[3][0], v[3][1], v[3][2], ur, vb);
			qd.Render(GL_TRIANGLE_STRIP);

			if (foglayer)
			{
				// If we get here we know that we have colored fog and no fixed colormap.
				gl_SetFog(foglevel, rel, &Colormap, additivefog);
				gl_RenderState.SetFixedColormap(CM_FOGLAYER);
				gl_RenderState.BlendEquation(GL_FUNC_ADD);
				gl_RenderState.BlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
				gl_RenderState.Apply();
				qd.Render(GL_TRIANGLE_STRIP);
				gl_RenderState.SetFixedColormap(CM_DEFAULT);
			}
		}
		else
		{
			gl_RenderModel(this);
		}
	}

	if (clipping)
	{
		gl_RenderState.EnableSplit(false);
	}

	if (pass==GLPASS_TRANSLUCENT)
	{
		gl_RenderState.EnableBrightmap(true);
		gl_RenderState.BlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
		gl_RenderState.BlendEquation(GL_FUNC_ADD);
		gl_RenderState.SetTextureMode(TM_MODULATE);
	}

	gl_RenderState.SetObjectColor(0xffffffff);
	gl_RenderState.EnableTexture(true);
	gl_RenderState.SetDynLight(0,0,0);
}